

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O1

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>::COpenGLCoreTexture
          (COpenGLCoreTexture<irr::video::COpenGL3DriverBase> *this,path *name,
          array<irr::video::IImage_*> *images,E_TEXTURE_TYPE type,COpenGL3DriverBase *driver)

{
  dimension2d<unsigned_int> *pdVar1;
  array<irr::video::IImage_*> *this_00;
  _func_int *p_Var2;
  dimension2d<unsigned_int> dVar3;
  dimension2d<unsigned_int> dVar4;
  E_TEXTURE_TYPE EVar5;
  long *plVar6;
  IImage *pIVar7;
  long lVar8;
  ITexture *texture;
  _func_int *p_Var9;
  pointer ppIVar10;
  bool bVar11;
  char cVar12;
  E_DRIVER_TYPE EVar13;
  IImage *pIVar14;
  void *pvVar15;
  pointer ppIVar16;
  undefined4 uVar17;
  ulong uVar18;
  GLenum GVar19;
  array<irr::video::IImage_*> *paVar20;
  double __x;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  int iVar24;
  undefined8 local_38;
  
  *(undefined8 *)&this->field_0xf8 = 0;
  *(undefined4 *)&this->field_0x100 = 1;
  (this->super_ITexture)._vptr_ITexture = (_func_int **)0x26a178;
  *(undefined8 *)&this->field_0xf0 = 0x26a1b8;
  irr::io::SNamedPath::SNamedPath(&(this->super_ITexture).NamedPath,name);
  (this->super_ITexture).OriginalSize.Width = 0;
  (this->super_ITexture).OriginalSize.Height = 0;
  (this->super_ITexture).Size.Width = 0;
  (this->super_ITexture).Size.Height = 0;
  (this->super_ITexture).DriverType = EDT_NULL;
  (this->super_ITexture).OriginalColorFormat = ECF_UNKNOWN;
  (this->super_ITexture).ColorFormat = ECF_UNKNOWN;
  (this->super_ITexture).Pitch = 0;
  (this->super_ITexture).HasMipMaps = false;
  (this->super_ITexture).IsRenderTarget = false;
  (this->super_ITexture).Source = ETS_UNKNOWN;
  (this->super_ITexture).Type = type;
  (this->super_ITexture)._vptr_ITexture = (_func_int **)0x26a0f0;
  *(undefined8 *)&this->field_0xf0 = 0x26a130;
  *(COpenGL3DriverBase **)&(this->super_ITexture).field_0x78 = driver;
  *(undefined8 *)&(this->super_ITexture).field_0x80 = 0xde1;
  *(undefined8 *)&(this->super_ITexture).field_0x88 = 0x190800001908;
  this->PixelType = 0x1401;
  this->Converter = (_func_void_void_ptr_s32_void_ptr *)0x0;
  this->LockReadOnly = false;
  this->LockImage = (IImage *)0x0;
  this->LockLayer = 0;
  this->KeepImage = false;
  (this->Images).m_data.
  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Images).m_data.
  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Images).m_data.
  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Images).is_sorted = true;
  this->MipLevelStored = '\0';
  this->LegacyAutoGenerateMipMaps = false;
  (this->StatesCache).AnisotropicFilter = '\0';
  (this->StatesCache).WrapU = '\0';
  (this->StatesCache).WrapV = '\0';
  (this->StatesCache).WrapW = '\0';
  (this->StatesCache).LODBias = '\0';
  (this->StatesCache).MinFilter = ETMINF_NEAREST_MIPMAP_NEAREST;
  (this->StatesCache).MagFilter = ETMAGF_NEAREST;
  (this->StatesCache).MipMapStatus = false;
  (this->StatesCache).IsCached = false;
  EVar13 = (*(driver->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x54])(driver);
  (this->super_ITexture).DriverType = EVar13;
  EVar5 = (this->super_ITexture).Type;
  uVar17 = 0xde1;
  if (EVar5 != ETT_2D) {
    if (EVar5 == ETT_CUBEMAP) {
      uVar17 = 0x8513;
    }
    else {
      os::Printer::log((Printer *)"COpenGLCoreTexture::TextureTypeIrrToGL unknown texture type",__x)
      ;
    }
  }
  *(undefined4 *)&(this->super_ITexture).field_0x80 = uVar17;
  plVar6 = *(long **)&(this->super_ITexture).field_0x78;
  bVar11 = (bool)(**(code **)(*plVar6 + 0x220))(plVar6,0x10);
  (this->super_ITexture).HasMipMaps = bVar11;
  plVar6 = *(long **)&(this->super_ITexture).field_0x78;
  bVar11 = (bool)(**(code **)(*plVar6 + 0x220))(plVar6,0x80);
  this->KeepImage = bVar11;
  getImageValues(this,*(images->m_data).
                       super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  if (*(int *)&(this->super_ITexture).field_0x88 != 0) {
    this_00 = &this->Images;
    if (((((this->KeepImage != false) ||
          ((this->super_ITexture).OriginalSize.Width != (this->super_ITexture).Size.Width)) ||
         ((this->super_ITexture).OriginalSize.Height != (this->super_ITexture).Size.Height)) ||
        (paVar20 = images,
        (this->super_ITexture).OriginalColorFormat != (this->super_ITexture).ColorFormat)) &&
       (std::vector<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>::resize
                  (&this_00->m_data,
                   (ulong)((long)(images->m_data).
                                 super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(images->m_data).
                                super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff),
       paVar20 = this_00,
       ((long)(images->m_data).
              super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(images->m_data).
              super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
              _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) != 0)) {
      pdVar1 = &(this->super_ITexture).Size;
      uVar18 = 0;
      do {
        plVar6 = *(long **)&(this->super_ITexture).field_0x78;
        pIVar14 = (IImage *)
                  (**(code **)(*plVar6 + 0x250))(plVar6,(this->super_ITexture).ColorFormat,pdVar1);
        ppIVar16 = (this->Images).m_data.
                   super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppIVar16[uVar18] = pIVar14;
        pIVar14 = (images->m_data).
                  super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar18];
        dVar3 = (this->super_ITexture).Size;
        iVar23 = -(uint)(dVar3.Width == (pIVar14->Size).Width);
        iVar24 = -(uint)(dVar3.Height == (pIVar14->Size).Height);
        auVar21._4_4_ = iVar23;
        auVar21._0_4_ = iVar23;
        auVar21._8_4_ = iVar24;
        auVar21._12_4_ = iVar24;
        iVar23 = movmskpd((int)ppIVar16,auVar21);
        pIVar7 = (this->Images).m_data.
                 super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar18];
        if (iVar23 == 3) {
          local_38 = 0;
          (*pIVar14->_vptr_IImage[7])(pIVar14,pIVar7,&local_38);
        }
        else {
          (*pIVar14->_vptr_IImage[6])(pIVar14,pIVar7);
        }
        pvVar15 = IImage::getMipMapsData
                            ((images->m_data).
                             super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar18],1);
        if (pvVar15 != (void *)0x0) {
          dVar3 = (this->super_ITexture).OriginalSize;
          dVar4 = *pdVar1;
          iVar23 = -(uint)(dVar4.Width == dVar3.Width);
          iVar24 = -(uint)(dVar4.Height == dVar3.Height);
          auVar22._0_8_ = (double)CONCAT44(iVar23,iVar23);
          auVar22._8_4_ = iVar24;
          auVar22._12_4_ = iVar24;
          iVar23 = movmskpd((int)pvVar15,auVar22);
          if ((iVar23 == 3) &&
             ((this->super_ITexture).OriginalColorFormat == (this->super_ITexture).ColorFormat)) {
            pIVar14 = (this_00->m_data).
                      super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar18];
            pvVar15 = IImage::getMipMapsData
                                ((images->m_data).
                                 super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar18],1);
            IImage::setMipMapsData(pIVar14,pvVar15,false);
          }
          else {
            os::Printer::log((Printer *)
                             "COpenGLCoreTexture: Can\'t handle format changes for mipmap data. Mipmap data dropped"
                             ,auVar22._0_8_);
          }
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < ((ulong)((long)(images->m_data).
                                       super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(images->m_data).
                                      super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff))
      ;
    }
    (*GL.GenTextures)(1,(GLuint *)&(this->super_ITexture).field_0x84);
    lVar8 = *(long *)(*(long *)&(this->super_ITexture).field_0x78 + 0x528);
    texture = *(ITexture **)(lVar8 + 0x20);
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::STextureCache::set((STextureCache *)(lVar8 + 0x10),0,&this->super_ITexture,EST_ACTIVE_ALWAYS);
    (*GL.TexParameteri)(*(GLenum *)&(this->super_ITexture).field_0x80,0x2801,0x2600);
    (*GL.TexParameteri)(*(GLenum *)&(this->super_ITexture).field_0x80,0x2800,0x2600);
    if ((this->super_ITexture).HasMipMaps == true) {
      plVar6 = *(long **)&(this->super_ITexture).field_0x78;
      cVar12 = (**(code **)(*plVar6 + 0x220))(plVar6,8);
      if (cVar12 == '\0') {
        plVar6 = *(long **)&(this->super_ITexture).field_0x78;
        cVar12 = (**(code **)(*plVar6 + 0x220))(plVar6,4);
        if (cVar12 == '\0') {
          GVar19 = 0x1100;
        }
        else {
          GVar19 = 0x1102;
        }
        (*GL.Hint)(0x8192,GVar19);
      }
      else {
        (*GL.Hint)(0x8192,0x1101);
      }
    }
    ppIVar16 = (paVar20->m_data).
               super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (((long)(paVar20->m_data).
               super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)ppIVar16 & 0x7fffffff8U) != 0) {
      uVar18 = 0;
      do {
        uploadTexture(this,true,(u32)uVar18,0,ppIVar16[uVar18]->Data);
        uVar18 = uVar18 + 1;
        ppIVar16 = (paVar20->m_data).
                   super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      } while (uVar18 < ((ulong)((long)(paVar20->m_data).
                                       super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar16)
                         >> 3 & 0xffffffff));
    }
    if ((((this->super_ITexture).HasMipMaps != false) && (this->LegacyAutoGenerateMipMaps == false))
       && (ppIVar16 = (paVar20->m_data).
                      super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
          ((long)(paVar20->m_data).
                 super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)ppIVar16 & 0x7fffffff8U) != 0)) {
      uVar18 = 0;
      do {
        pvVar15 = IImage::getMipMapsData(ppIVar16[uVar18],1);
        (*(this->super_ITexture)._vptr_ITexture[2])(this,pvVar15,uVar18 & 0xffffffff);
        uVar18 = uVar18 + 1;
        ppIVar16 = (paVar20->m_data).
                   super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      } while (uVar18 < ((ulong)((long)(paVar20->m_data).
                                       super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar16)
                         >> 3 & 0xffffffff));
    }
    if (this->KeepImage == false) {
      ppIVar16 = (this->Images).m_data.
                 super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (((long)(this->Images).m_data.
                 super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)ppIVar16 & 0x7fffffff8U) != 0) {
        uVar18 = 0;
        do {
          pIVar14 = ppIVar16[uVar18];
          p_Var9 = pIVar14->_vptr_IImage[0xfffffffffffffffd];
          p_Var2 = (_func_int *)((long)&(pIVar14->Size).Height + (long)p_Var9);
          *(int *)p_Var2 = *(int *)p_Var2 + -1;
          if (*(int *)p_Var2 == 0) {
            (**(code **)(*(long *)((long)&pIVar14->_vptr_IImage + (long)p_Var9) + 8))();
          }
          uVar18 = uVar18 + 1;
          ppIVar16 = (this->Images).m_data.
                     super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar18 < ((ulong)((long)(this->Images).m_data.
                                         super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar16
                                  ) >> 3 & 0xffffffff));
      }
      ppIVar10 = (this->Images).m_data.
                 super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      (this_00->m_data).
      super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->Images).m_data.
      super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->Images).m_data.
      super__Vector_base<irr::video::IImage_*,_std::allocator<irr::video::IImage_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (ppIVar16 != (pointer)0x0) {
        operator_delete(ppIVar16,(long)ppIVar10 - (long)ppIVar16);
      }
      (this->Images).is_sorted = true;
    }
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::STextureCache::set
              ((STextureCache *)
               (*(long *)(*(long *)&(this->super_ITexture).field_0x78 + 0x528) + 0x10),0,texture,
               EST_ACTIVE_ALWAYS);
  }
  return;
}

Assistant:

COpenGLCoreTexture(const io::path &name, const core::array<IImage *> &images, E_TEXTURE_TYPE type, TOpenGLDriver *driver) :
			ITexture(name, type), Driver(driver), TextureType(GL_TEXTURE_2D),
			TextureName(0), InternalFormat(GL_RGBA), PixelFormat(GL_RGBA), PixelType(GL_UNSIGNED_BYTE), Converter(0), LockReadOnly(false), LockImage(0), LockLayer(0),
			KeepImage(false), MipLevelStored(0), LegacyAutoGenerateMipMaps(false)
	{
		_IRR_DEBUG_BREAK_IF(images.size() == 0)

		DriverType = Driver->getDriverType();
		TextureType = TextureTypeIrrToGL(Type);
		HasMipMaps = Driver->getTextureCreationFlag(ETCF_CREATE_MIP_MAPS);
		KeepImage = Driver->getTextureCreationFlag(ETCF_ALLOW_MEMORY_COPY);

		getImageValues(images[0]);
		if (!InternalFormat)
			return;

		const core::array<IImage *> *tmpImages = &images;

		if (KeepImage || OriginalSize != Size || OriginalColorFormat != ColorFormat) {
			Images.set_used(images.size());

			for (u32 i = 0; i < images.size(); ++i) {
				Images[i] = Driver->createImage(ColorFormat, Size);

				if (images[i]->getDimension() == Size)
					images[i]->copyTo(Images[i]);
				else
					images[i]->copyToScaling(Images[i]);

				if (images[i]->getMipMapsData()) {
					if (OriginalSize == Size && OriginalColorFormat == ColorFormat) {
						Images[i]->setMipMapsData(images[i]->getMipMapsData(), false);
					} else {
						// TODO: handle at least mipmap with changing color format
						os::Printer::log("COpenGLCoreTexture: Can't handle format changes for mipmap data. Mipmap data dropped", ELL_WARNING);
					}
				}
			}

			tmpImages = &Images;
		}

		GL.GenTextures(1, &TextureName);

		const COpenGLCoreTexture *prevTexture = Driver->getCacheHandler()->getTextureCache().get(0);
		Driver->getCacheHandler()->getTextureCache().set(0, this);

		GL.TexParameteri(TextureType, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		GL.TexParameteri(TextureType, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

#ifdef GL_GENERATE_MIPMAP_HINT
		if (HasMipMaps) {
			if (Driver->getTextureCreationFlag(ETCF_OPTIMIZED_FOR_SPEED))
				GL.Hint(GL_GENERATE_MIPMAP_HINT, GL_FASTEST);
			else if (Driver->getTextureCreationFlag(ETCF_OPTIMIZED_FOR_QUALITY))
				GL.Hint(GL_GENERATE_MIPMAP_HINT, GL_NICEST);
			else
				GL.Hint(GL_GENERATE_MIPMAP_HINT, GL_DONT_CARE);
		}
#endif

		for (u32 i = 0; i < (*tmpImages).size(); ++i)
			uploadTexture(true, i, 0, (*tmpImages)[i]->getData());

		if (HasMipMaps && !LegacyAutoGenerateMipMaps) {
			// Create mipmaps (either from image mipmaps or generate them)
			for (u32 i = 0; i < (*tmpImages).size(); ++i) {
				void *mipmapsData = (*tmpImages)[i]->getMipMapsData();
				regenerateMipMapLevels(mipmapsData, i);
			}
		}

		if (!KeepImage) {
			for (u32 i = 0; i < Images.size(); ++i)
				Images[i]->drop();

			Images.clear();
		}

		Driver->getCacheHandler()->getTextureCache().set(0, prevTexture);

		Driver->testGLError(__LINE__);
	}